

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O2

void __thiscall Diligent::SerializedData::Free(SerializedData *this)

{
  IMemoryAllocator *pIVar1;
  
  pIVar1 = this->m_pAllocator;
  if (pIVar1 != (IMemoryAllocator *)0x0) {
    (*pIVar1->_vptr_IMemoryAllocator[1])(pIVar1,this->m_Ptr);
  }
  this->m_pAllocator = (IMemoryAllocator *)0x0;
  this->m_Ptr = (void *)0x0;
  this->m_Size = 0;
  LOCK();
  (this->m_Hash).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  return;
}

Assistant:

void SerializedData::Free()
{
    if (m_pAllocator != nullptr)
    {
        m_pAllocator->Free(m_Ptr);
    }

    m_pAllocator = nullptr;
    m_Ptr        = nullptr;
    m_Size       = 0;
    m_Hash.store(0);
}